

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::test(Node *__return_storage_ptr__,Parser *this)

{
  lexemtype lVar1;
  Node local_280;
  Node local_240;
  allocator local_1f9;
  string local_1f8 [32];
  Node local_1d8;
  undefined1 local_198 [8];
  Node thisNode_1;
  Node local_118;
  allocator local_d1;
  string local_d0 [32];
  Node local_b0;
  undefined1 local_70 [8];
  Node thisNode;
  Parser *this_local;
  Node *testNode;
  
  sum(__return_storage_ptr__,this);
  lVar1 = getLexemType(this);
  if (lVar1 == LESS) {
    nextLexem(this);
    Node::Node((Node *)local_70,__return_storage_ptr__);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",&local_d1);
    Node::Node(&local_b0,COMPL,(string *)local_d0);
    Node::operator=(__return_storage_ptr__,&local_b0);
    Node::~Node(&local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    Node::Node(&local_118,(Node *)local_70);
    Node::addSubnode(__return_storage_ptr__,&local_118);
    Node::~Node(&local_118);
    sum((Node *)&thisNode_1.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,this);
    Node::addSubnode(__return_storage_ptr__,
                     (Node *)&thisNode_1.subnodes.super__Vector_base<Node,_std::allocator<Node>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    Node::~Node((Node *)&thisNode_1.subnodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
    Node::~Node((Node *)local_70);
  }
  else {
    lVar1 = getLexemType(this);
    if (lVar1 == MORE) {
      nextLexem(this);
      Node::Node((Node *)local_198,__return_storage_ptr__);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"",&local_1f9);
      Node::Node(&local_1d8,COMPR,(string *)local_1f8);
      Node::operator=(__return_storage_ptr__,&local_1d8);
      Node::~Node(&local_1d8);
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      Node::Node(&local_240,(Node *)local_198);
      Node::addSubnode(__return_storage_ptr__,&local_240);
      Node::~Node(&local_240);
      sum(&local_280,this);
      Node::addSubnode(__return_storage_ptr__,&local_280);
      Node::~Node(&local_280);
      Node::~Node((Node *)local_198);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Node Parser::test() { // todo make "compare" with operator
    Node testNode = sum();
    if (getLexemType() == LESS) {
        nextLexem();
        Node thisNode = Node(testNode);
        testNode = Node(COMPL);
        testNode.addSubnode(thisNode);
        testNode.addSubnode(sum());
    } else if (getLexemType() == MORE) {
        nextLexem();
        Node thisNode = Node(testNode);
        testNode = Node(COMPR);
        testNode.addSubnode(thisNode);
        testNode.addSubnode(sum());
    }
    return testNode;
}